

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  bool bVar9;
  byte *pbVar10;
  long lVar11;
  char_t *__dest;
  char *pcVar12;
  xpath_ast_node *pxVar13;
  xpath_ast_node *pxVar14;
  byte bVar15;
  char cVar16;
  byte bVar17;
  uchar table [128];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  bVar17 = this->_type;
  if ((bVar17 & 0xfe) != 0x10) {
    if (bVar17 == 0x2c) {
      pxVar13 = this->_right;
      if (pxVar13 == (xpath_ast_node *)0x0) {
        return;
      }
      if (pxVar13->_type != '\x12') {
        return;
      }
      if (pxVar13->_next->_type != '\x12') {
        return;
      }
      pbVar10 = (byte *)(pxVar13->_data).string;
      pcVar12 = (pxVar13->_next->_data).string;
      local_28 = (undefined1  [16])0x0;
      local_38 = (undefined1  [16])0x0;
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      bVar15 = *pbVar10;
      if (bVar15 != 0) {
        do {
          pbVar10 = pbVar10 + 1;
          bVar17 = 0x2c;
          if (((char)bVar15 < '\0') || (cVar8 = *pcVar12, cVar8 < '\0')) goto LAB_0011bd9e;
          if (local_98[bVar15] == '\0') {
            cVar16 = cVar8;
            if (cVar8 == '\0') {
              cVar16 = -0x80;
            }
            local_98[bVar15] = cVar16;
          }
          pcVar12 = pcVar12 + (cVar8 != '\0');
          bVar15 = *pbVar10;
        } while (bVar15 != 0);
      }
      lVar11 = 0;
      do {
        cVar8 = local_98[lVar11];
        cVar16 = local_98[lVar11 + 1];
        cVar1 = local_98[lVar11 + 2];
        cVar2 = local_98[lVar11 + 3];
        cVar3 = local_98[lVar11 + 4];
        cVar4 = local_98[lVar11 + 5];
        cVar5 = local_98[lVar11 + 6];
        cVar6 = local_98[lVar11 + 7];
        cVar7 = (char)lVar11;
        if (cVar8 == '\0') {
          local_98[lVar11] = cVar7;
        }
        if (cVar16 == '\0') {
          local_98[lVar11 + 1] = cVar7 + '\x01';
        }
        if (cVar1 == '\0') {
          local_98[lVar11 + 2] = cVar7 + '\x02';
        }
        if (cVar2 == '\0') {
          local_98[lVar11 + 3] = cVar7 + '\x03';
        }
        if (cVar3 == '\0') {
          local_98[lVar11 + 4] = cVar7 + '\x04';
        }
        if (cVar4 == '\0') {
          local_98[lVar11 + 5] = cVar7 + '\x05';
        }
        if (cVar5 == '\0') {
          local_98[lVar11 + 6] = cVar7 + '\x06';
        }
        if (cVar6 == '\0') {
          local_98[lVar11 + 7] = cVar7 + '\a';
        }
        if (cVar8 == '\0') {
          local_98[lVar11 + 8] = cVar7 + '\b';
        }
        if (cVar16 == '\0') {
          local_98[lVar11 + 9] = cVar7 + '\t';
        }
        if (cVar1 == '\0') {
          local_98[lVar11 + 10] = cVar7 + '\n';
        }
        if (cVar2 == '\0') {
          local_98[lVar11 + 0xb] = cVar7 + '\v';
        }
        if (cVar3 == '\0') {
          local_98[lVar11 + 0xc] = cVar7 + '\f';
        }
        if (cVar4 == '\0') {
          local_98[lVar11 + 0xd] = cVar7 + '\r';
        }
        if (cVar5 == '\0') {
          local_98[lVar11 + 0xe] = cVar7 + '\x0e';
        }
        if (cVar6 == '\0') {
          local_98[lVar11 + 0xf] = cVar7 + '\x0f';
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x80);
      __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
      if (__dest != (char_t *)0x0) {
        memcpy(__dest,local_98,0x80);
        this->_type = ':';
        (this->_data).string = __dest;
        return;
      }
      bVar17 = this->_type;
    }
    else if (bVar17 == 0x38) {
      bVar17 = this->_axis;
      if (0xc < bVar17) {
        return;
      }
      if ((0x1038U >> (bVar17 & 0x1f) & 1) == 0) {
        return;
      }
      pxVar13 = this->_left;
      if (pxVar13 == (xpath_ast_node *)0x0) {
        return;
      }
      if (pxVar13->_type != '8') {
        return;
      }
      if (pxVar13->_axis != '\x05') {
        return;
      }
      if (pxVar13->_test != '\x02') {
        return;
      }
      if (pxVar13->_right != (xpath_ast_node *)0x0) {
        return;
      }
      pxVar14 = this->_right;
      while( true ) {
        if (pxVar14 == (xpath_ast_node *)0x0) {
          this->_axis = (byte)(bVar17 - 3) < 2 ^ 5;
          this->_left = pxVar13->_left;
          return;
        }
        if (pxVar14->_test != '\x01') break;
        pxVar14 = pxVar14->_next;
      }
      return;
    }
LAB_0011bd9e:
    if (bVar17 != 3) {
      return;
    }
    pxVar13 = this->_left;
    if (pxVar13 == (xpath_ast_node *)0x0) {
      return;
    }
    pxVar14 = this->_right;
    if (pxVar14 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar13->_type != '8') {
      return;
    }
    if (pxVar13->_axis != '\x02') {
      return;
    }
    if (pxVar13->_test != '\x01') {
      return;
    }
    if (pxVar13->_left != (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar13->_right != (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar14->_type != '\x12') {
      if (pxVar14->_type != '\x14') {
        return;
      }
      if (pxVar14->_rettype != '\x03') {
        return;
      }
    }
    this->_type = ';';
    return;
  }
  pxVar13 = this->_right;
  if (pxVar13 == (xpath_ast_node *)0x0) {
    return;
  }
  cVar8 = pxVar13->_type;
  if (cVar8 == '\x03') {
    cVar8 = '\x03';
    if ((pxVar13->_left->_type != '\x16') ||
       (pxVar14 = pxVar13->_right, pxVar14->_rettype != '\x02')) goto LAB_0011bd7a;
    this->_right = pxVar14;
    cVar8 = pxVar14->_type;
    pxVar13 = pxVar14;
  }
  if (cVar8 == '\x13') {
    if (((pxVar13->_data).number == 1.0) && (!NAN((pxVar13->_data).number))) {
      this->_test = '\x03';
      return;
    }
    cVar8 = '\x13';
  }
LAB_0011bd7a:
  if (pxVar13->_rettype == '\x02') {
    if ((byte)(cVar8 - 0x13U) < 3) {
      this->_test = '\x02';
    }
  }
  else {
    bVar9 = is_posinv_expr(pxVar13);
    if (bVar9) {
      this->_test = '\x01';
    }
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}